

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void essence_of_plasma_pulse(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  CHAR_DATA *pCVar6;
  CHAR_DATA **ppCVar7;
  
  pCVar6 = room->people;
  if (pCVar6 != (CHAR_DATA *)0x0) {
    bVar3 = false;
    for (; pCVar6 != (CHAR_DATA *)0x0; pCVar6 = pCVar6->next_in_room) {
      bVar2 = is_safe_new(af->owner,pCVar6,false);
      bVar3 = (bool)(bVar3 | !bVar2);
    }
    if (bVar3) {
      bVar3 = false;
      pCVar6 = (CHAR_DATA *)0x0;
      while (ppCVar7 = &room->people, !bVar3) {
        while( true ) {
          pCVar6 = *ppCVar7;
          bVar3 = pCVar6 != (CHAR_DATA *)0x0;
          if ((pCVar6 == (CHAR_DATA *)0x0) ||
             ((bVar2 = is_safe_new(af->owner,pCVar6,false), !bVar2 &&
              (iVar5 = number_percent(), 0x4f < iVar5)))) break;
          ppCVar7 = &pCVar6->next_in_room;
        }
      }
      pCVar1 = pCVar6->fighting;
      if (af->modifier == 0) {
        af->modifier = 1;
      }
      iVar5 = dice((int)af->level,10);
      sVar4 = af->modifier;
      act("The ball of plasma hurtles about wildly, discharging pure energy into you!",pCVar6,
          (void *)0x0,(void *)0x0,3);
      act("The ball of plasma hurtles about wildly, discharging pure energy into $n!",pCVar6,
          (void *)0x0,(void *)0x0,0);
      damage_new(af->owner,pCVar6,iVar5 / (int)sVar4,(int)gsn_essence_of_plasma,0xb,true,false,0,1,
                 "the essence of plasma*");
      if ((pCVar1 == (CHAR_DATA *)0x0) && (bVar3 = is_npc(pCVar6), !bVar3)) {
        stop_fighting(pCVar6,true);
      }
      sVar4 = (short)*(undefined4 *)&af->modifier + 1;
      af->modifier = sVar4;
      if (0x18 < sVar4) {
        affect_remove_room(room,af);
        return;
      }
    }
  }
  return;
}

Assistant:

void essence_of_plasma_pulse(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim;
	bool valid_target = false, found = false, fighting = false;
	int dam;

	if (!room->people)
		return;

	for (victim = room->people; victim; victim = victim->next_in_room)
	{
		if (!is_safe_new(af->owner, victim, false))
			valid_target = true;
	}

	if (!valid_target)
		return;

	while (!found)
	{
		for (victim = room->people; victim; victim = victim->next_in_room)
		{
			if (is_safe_new(af->owner, victim, false))
				continue;

			if (number_percent() < 80)
				continue;

			found = true;
			break;
		}
	}

	if (victim->fighting)
		fighting = true;

	if (af->modifier == 0)
		af->modifier = 1;

	dam = dice(af->level, 10) / af->modifier;

	act("The ball of plasma hurtles about wildly, discharging pure energy into you!", victim, 0, 0, TO_CHAR);
	act("The ball of plasma hurtles about wildly, discharging pure energy into $n!", victim, 0, 0, TO_ROOM);

	damage_new(af->owner, victim, dam, gsn_essence_of_plasma, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the essence of plasma*");

	if (!fighting && !is_npc(victim))
		stop_fighting(victim, true);

	af->modifier++;

	if (af->modifier >= 25)
		affect_remove_room(room, af);
}